

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O0

bool __thiscall helics::MessageFederateManager::hasMessage(MessageFederateManager *this)

{
  bool bVar1;
  EndpointData *mq;
  const_iterator __end1;
  const_iterator __begin1;
  shared_handle *__range1;
  shared_handle eptDat;
  shared_lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  *in_stack_ffffffffffffff58;
  undefined7 in_stack_ffffffffffffff60;
  shared_guarded_opt<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  *in_stack_ffffffffffffff98;
  _Self local_50;
  undefined1 *local_30;
  undefined1 local_28 [39];
  byte local_1;
  
  gmlc::libguarded::
  shared_guarded_opt<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  ::lock_shared(in_stack_ffffffffffffff98);
  local_30 = local_28;
  gmlc::libguarded::
  shared_lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  ::begin(in_stack_ffffffffffffff58);
  gmlc::libguarded::
  shared_lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
  ::end(in_stack_ffffffffffffff58);
  do {
    bVar1 = std::operator==(&local_50,(_Self *)&stack0xffffffffffffff80);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_1 = 0;
LAB_002786cb:
      gmlc::libguarded::
      shared_lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
      ::~shared_lock_handle
                ((shared_lock_handle<std::deque<helics::MessageFederateManager::EndpointData,_std::allocator<helics::MessageFederateManager::EndpointData>_>,_std::shared_mutex>
                  *)0x2786d8);
      return (bool)(local_1 & 1);
    }
    std::
    _Deque_iterator<helics::MessageFederateManager::EndpointData,_const_helics::MessageFederateManager::EndpointData_&,_const_helics::MessageFederateManager::EndpointData_*>
    ::operator*(&local_50);
    bVar1 = gmlc::containers::
            SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
            ::empty((SimpleQueue<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::mutex>
                     *)0x27866e);
    if (!bVar1) {
      local_1 = 1;
      goto LAB_002786cb;
    }
    std::
    _Deque_iterator<helics::MessageFederateManager::EndpointData,_const_helics::MessageFederateManager::EndpointData_&,_const_helics::MessageFederateManager::EndpointData_*>
    ::operator++((_Deque_iterator<helics::MessageFederateManager::EndpointData,_const_helics::MessageFederateManager::EndpointData_&,_const_helics::MessageFederateManager::EndpointData_*>
                  *)CONCAT17(bVar1,in_stack_ffffffffffffff60));
  } while( true );
}

Assistant:

bool MessageFederateManager::hasMessage() const
{
    auto eptDat = eptData.lock_shared();
    for (const auto& mq : eptDat) {
        if (!mq.messages.empty()) {
            return true;
        }
    }
    return false;
}